

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# action_score.h
# Opt level: O3

int exploration::
    generate_bag<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,ACTION_SCORE::score_iterator>
              (float *top_actions_first,float *top_actions_last,long param_3,long param_4)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  float *pfVar4;
  bool bVar5;
  float fVar6;
  
  uVar1 = *(ulong *)(param_3 + 8);
  iVar3 = 1;
  if (uVar1 < *(ulong *)(param_4 + 8)) {
    if (top_actions_first == top_actions_last) {
      fVar6 = 0.0;
    }
    else {
      fVar6 = 0.0;
      pfVar4 = top_actions_first;
      do {
        fVar6 = fVar6 + *pfVar4;
        pfVar4 = pfVar4 + 1;
      } while (pfVar4 != top_actions_last);
    }
    if (fVar6 <= 1e-06) {
      *(undefined4 *)(uVar1 + 4) = 0x3f800000;
      iVar3 = 0;
      lVar2 = *(long *)(param_3 + 8);
      while (lVar2 + 8 != *(long *)(param_4 + 8)) {
        *(undefined4 *)(lVar2 + 0xc) = 0;
        lVar2 = lVar2 + 8;
      }
    }
    else {
      iVar3 = 0;
      if (top_actions_first != top_actions_last) {
        pfVar4 = top_actions_first + 1;
        do {
          *(float *)(uVar1 + 4) = pfVar4[-1] * (1.0 / fVar6);
          if (uVar1 + 8 == *(ulong *)(param_4 + 8)) {
            return 0;
          }
          bVar5 = pfVar4 != top_actions_last;
          pfVar4 = pfVar4 + 1;
          uVar1 = uVar1 + 8;
        } while (bVar5);
      }
    }
  }
  return iVar3;
}

Assistant:

bool operator!=(const score_iterator& other) const { return _p != other._p; }